

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_opt.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  float *gray_image;
  integral_image *iimage_00;
  fasthessian *__ptr;
  int in_EDI;
  fasthessian *unaff_retaddr;
  int i;
  vector<interest_point,_std::allocator<interest_point>_> interest_points;
  fasthessian *fh;
  integral_image *iimage;
  float *image;
  int channels;
  int height;
  int width;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  fasthessian *in_stack_ffffffffffffffb0;
  int *in_stack_ffffffffffffffb8;
  int *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  undefined4 uVar1;
  int iVar2;
  
  uVar1 = 0;
  if (in_EDI == 3) {
    stbi_ldr_to_hdr_gamma(1.0);
    gray_image = stbi_loadf(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                            in_stack_ffffffffffffffb8,(int *)in_stack_ffffffffffffffb0,
                            in_stack_ffffffffffffffac);
    if (gray_image == (float *)0x0) {
      printf("Could not open or find image\n");
      iVar2 = -1;
    }
    else {
      iimage_00 = create_integral_img(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0);
      compute_integral_img(gray_image,iimage_00);
      __ptr = create_fast_hessian((integral_image *)
                                  CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      create_response_map(in_stack_ffffffffffffffb0);
      compute_response_layers
                ((fasthessian *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      std::vector<interest_point,_std::allocator<interest_point>_>::vector
                ((vector<interest_point,_std::allocator<interest_point>_> *)0x17ffc1);
      std::vector<interest_point,_std::allocator<interest_point>_>::reserve
                ((vector<interest_point,_std::allocator<interest_point>_> *)iimage_00,
                 (size_type)__ptr);
      get_interest_points(unaff_retaddr,
                          (vector<interest_point,_std::allocator<interest_point>_> *)
                          CONCAT44(uVar1,in_EDI));
      get_msurf_descriptors_rounding_unroll_2_24_True_winner
                ((integral_image *)in_stack_ffffffffffffffb0,
                 (vector<interest_point,_std::allocator<interest_point>_> *)
                 CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      stbi_image_free((void *)0x17fffd);
      free(iimage_00->padded_data);
      free(iimage_00);
      for (iVar2 = 0; iVar2 < 4; iVar2 = iVar2 + 1) {
        free(__ptr->response_map[iVar2]->response);
        free(__ptr->response_map[iVar2]->laplacian);
        free(__ptr->response_map[iVar2]);
      }
      free(__ptr);
      aligned_free((void *)0x1800a8);
      aligned_free((void *)0x1800b9);
      iVar2 = 0;
      std::vector<interest_point,_std::allocator<interest_point>_>::~vector
                ((vector<interest_point,_std::allocator<interest_point>_> *)
                 in_stack_ffffffffffffffb0);
    }
  }
  else {
    printf("Invaid argument count.\nUsage:\n\t./surf image_path descriptor_file_target_path\n");
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int main(int argc, char const *argv[])
{
    if (argc != 3) {
        printf("Invaid argument count.\nUsage:\n\t./surf image_path descriptor_file_target_path\n");
        return 1;
    }
    int width, height, channels;

    // Load image
    stbi_ldr_to_hdr_gamma(1.0f);
    float* image = stbi_loadf(argv[1], &width, &height, &channels, STBI_grey);

    if (!image) {
        printf("Could not open or find image\n");
        return -1;
    }

    // Create integral image
    struct integral_image* iimage = create_integral_img(width, height);
    // Compute integral image
    compute_integral_img(image, iimage);

    // Fast-Hessian
    struct fasthessian* fh = create_fast_hessian(iimage);

    // Create octaves with response layers
    create_response_map(fh);

	// Compute responses for every layer
	compute_response_layers(fh);

    // Getting interest points with non-maximum supression
    std::vector<struct interest_point> interest_points;
    interest_points.reserve(1000);
    
    get_interest_points(fh, &interest_points);

    // Getting M-SURF descriptors for each interest point
	get_msurf_descriptors_rounding_unroll_2_24_True_winner(iimage, &interest_points);


    // skipping this part as it adds nise for profiler
    /*
    // Write results to file
    FILE * fp = fopen(argv[2],"w");
    printf("%d %d %d\n", iimage->width, iimage->height, channels);
    for (size_t i=0; i<interest_points.size(); ++i) {
        fprintf(fp, "%f %f %f %d ", interest_points[i].x, interest_points[i].y, interest_points[i].scale, interest_points[i].laplacian);
        for(size_t j = 0; j < 64; j++) {
            fprintf(fp, "%f ", interest_points[i].descriptor[j]);
        }
        fprintf(fp, "\n");
    }
    fclose(fp);
    */

    // Free memory
    stbi_image_free(image); // possibly move this to create_integral_img
    free(iimage->padded_data);
    free(iimage);
    for (int i = 0; i < NUM_LAYERS; ++i) {
        free(fh->response_map[i]->response);
		free(fh->response_map[i]->laplacian);
        free(fh->response_map[i]);
    }
    free(fh);

    extern float* haarResponseX;
    extern float* haarResponseY;

    aligned_free(haarResponseX);
    aligned_free(haarResponseY);

    return 0;
}